

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O3

bool __thiscall Web_Constraint::Is_Instance_Of(Web_Constraint *this,Am_Constraint *proto)

{
  Am_Web_Data *pAVar1;
  int iVar2;
  Am_Web_Data **ppAVar3;
  
  iVar2 = (**(proto->super_Am_Registered_Type)._vptr_Am_Registered_Type)(proto);
  if ((Am_ID_Tag)iVar2 == Am_Web_Data::id) {
    ppAVar3 = &this->owner;
    do {
      pAVar1 = *ppAVar3;
      if (pAVar1 == (Am_Web_Data *)0x0) break;
      ppAVar3 = &pAVar1->prototype;
    } while (pAVar1 != (Am_Web_Data *)proto[1].super_Am_Registered_Type._vptr_Am_Registered_Type);
    if (pAVar1 != (Am_Web_Data *)0x0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
Web_Constraint::Is_Instance_Of(Am_Constraint *proto)
{
  if (proto->ID() == Am_Web_Data::id) {
    Am_Web_Data *proto_data = ((Web_Constraint *)proto)->owner;
    Am_Web_Data *curr;
    for (curr = owner; curr; curr = curr->prototype)
      if (curr == proto_data)
        return true;
  }
  return false;
}